

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined7 extraout_var;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  LinkClosure *pLVar14;
  long *plVar15;
  undefined7 extraout_var_00;
  size_type *psVar16;
  pointer pbVar17;
  ulong uVar18;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar19;
  string d;
  string suffix;
  string rootPath;
  string local_128;
  string local_108;
  string local_e8;
  undefined4 local_c8;
  allocator local_c4;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  undefined1 local_b8 [32];
  _Base_ptr local_98;
  size_t local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  char *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  pcVar5 = local_b8 + 0x10;
  local_c0 = runtimeDirs;
  local_b8._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CMAKE_SKIP_RPATH","");
  bVar6 = cmMakefile::IsOn(pcVar2,(string *)local_b8);
  sVar3 = (this->RuntimeFlag)._M_string_length;
  if ((pointer)local_b8._0_8_ != pcVar5) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  bVar7 = true;
  if (!for_install) {
    pcVar4 = this->Target;
    local_b8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"BUILD_WITH_INSTALL_RPATH","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_b8);
    if ((pointer)local_b8._0_8_ != pcVar5) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  if (bVar6 || sVar3 == 0) {
    local_c8 = 0;
  }
  else {
    bVar6 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar8 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_c8 = (undefined4)CONCAT71(extraout_var,bVar8 & (bVar7 ^ 1U));
    if ((bVar7 ^ 1U) == 0) {
      pcVar2 = this->Makefile;
      local_b8._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"CMAKE_SKIP_INSTALL_RPATH","");
      bVar8 = cmMakefile::IsOn(pcVar2,(string *)local_b8);
      if (bVar8) {
        uVar18 = 0;
      }
      else {
        pcVar4 = this->Target;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"INSTALL_RPATH_USE_LINK_PATH","");
        bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_e8);
        uVar18 = CONCAT71(extraout_var_00,bVar8) & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_b8._0_8_ != pcVar5) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      local_b8._24_8_ = local_b8 + 8;
      local_b8._8_4_ = _S_red;
      local_b8._16_8_ = 0;
      local_90 = 0;
      local_98 = (_Base_ptr)local_b8._24_8_;
      if ((bVar7 & bVar6) != 0) {
        pcVar4 = this->Target;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"INSTALL_RPATH","");
        pcVar9 = cmGeneratorTarget::GetProperty(pcVar4,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        cmCLI_ExpandListUnique
                  (pcVar9,local_c0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8);
      }
      goto LAB_002f4a62;
    }
  }
  local_b8._24_8_ = local_b8 + 8;
  local_b8._8_4_ = _S_red;
  uVar18 = 0;
  local_b8._16_8_ = 0;
  local_90 = 0;
  local_98 = (_Base_ptr)local_b8._24_8_;
LAB_002f4a62:
  if (((char)uVar18 != '\0') || ((char)local_c8 != '\0')) {
    pcVar2 = this->Makefile;
    paVar1 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_SYSROOT","");
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar2,&local_128);
    std::__cxx11::string::string((string *)&local_e8,pcVar9,(allocator *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_STAGING_PREFIX","");
    pcVar9 = cmMakefile::GetDefinition(pcVar2,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_INSTALL_PREFIX","");
    local_80 = cmMakefile::GetSafeDefinition(pcVar2,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_e8);
    local_78 = uVar18;
    pvVar10 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
    pbVar17 = (pvVar10->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar17 !=
        (pvVar10->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_88 = pvVar10;
      do {
        if ((char)local_c8 == '\0') {
          if ((char)local_78 != '\0') {
            pcVar12 = cmake::GetHomeDirectory(this->CMakeInstance);
            pcVar13 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
            std::__cxx11::string::string((string *)&local_128,pcVar12,&local_c1);
            bVar6 = cmsys::SystemTools::ComparePath(pbVar17,&local_128);
            if (bVar6) {
              bVar6 = false;
            }
            else {
              std::__cxx11::string::string((string *)&local_108,pcVar13,&local_c2);
              bVar6 = cmsys::SystemTools::ComparePath(pbVar17,&local_108);
              if (bVar6) {
                bVar6 = false;
              }
              else {
                std::__cxx11::string::string((string *)&local_50,pcVar12,&local_c3);
                bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar17,&local_50);
                if (bVar6) {
                  bVar6 = false;
                }
                else {
                  std::__cxx11::string::string((string *)&local_70,pcVar13,&local_c4);
                  bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar17,&local_70);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  bVar6 = !bVar6;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            pvVar10 = local_88;
            if (bVar6) {
              pcVar5 = (pbVar17->_M_dataplus)._M_p;
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,pcVar5,pcVar5 + pbVar17->_M_string_length);
              if ((local_e8._M_string_length == 0) ||
                 (lVar11 = std::__cxx11::string::find
                                     ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p,0),
                 lVar11 != 0)) {
                if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
                  strlen(pcVar9);
                  lVar11 = std::__cxx11::string::find((char *)&local_128,(ulong)pcVar9,0);
                  if (lVar11 == 0) {
                    strlen(pcVar9);
                    std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_128);
                    pcVar12 = local_80;
                    sVar3 = local_128._M_string_length;
                    strlen(local_80);
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_128,0,(char *)sVar3,(ulong)pcVar12);
                    std::__cxx11::string::append((char *)&local_128);
                    std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)local_108._M_dataplus._M_p);
                    cmsys::SystemTools::ConvertToUnixSlashes(&local_128);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_002f4ff0;
                  }
                }
              }
              else {
                std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_128);
                std::__cxx11::string::operator=((string *)&local_128,(string *)&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_002f4ff0:
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
              }
              pVar19 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)local_b8,&local_128);
              if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_c0,&local_128);
              }
              goto LAB_002f4da6;
            }
          }
        }
        else {
          pcVar5 = (pbVar17->_M_dataplus)._M_p;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar5,pcVar5 + pbVar17->_M_string_length);
          if ((local_e8._M_string_length == 0) ||
             (lVar11 = std::__cxx11::string::find
                                 ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p,0),
             lVar11 != 0)) {
            if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
              strlen(pcVar9);
              lVar11 = std::__cxx11::string::find((char *)&local_128,(ulong)pcVar9,0);
              if (lVar11 == 0) {
                strlen(pcVar9);
                std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_128);
                pcVar12 = local_80;
                sVar3 = local_128._M_string_length;
                strlen(local_80);
                std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)sVar3,(ulong)pcVar12);
                std::__cxx11::string::append((char *)&local_128);
                std::__cxx11::string::_M_append
                          ((char *)&local_128,(ulong)local_108._M_dataplus._M_p);
                cmsys::SystemTools::ConvertToUnixSlashes(&local_128);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_002f4d77;
              }
            }
          }
          else {
            std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_128);
            std::__cxx11::string::operator=((string *)&local_128,(string *)&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_002f4d77:
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pVar19 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_b8,&local_128);
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_c0,&local_128);
          }
LAB_002f4da6:
          pvVar10 = local_88;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
            pvVar10 = local_88;
          }
        }
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 !=
               (pvVar10->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  pLVar14 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  pbVar17 = (pLVar14->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar17 !=
      (pLVar14->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_128.field_2;
    do {
      std::operator+(&local_128,"CMAKE_",pbVar17);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar16 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_e8.field_2._M_allocated_capacity = *psVar16;
        local_e8.field_2._8_8_ = plVar15[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar16;
        local_e8._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_e8._M_string_length = plVar15[1];
      *plVar15 = (long)psVar16;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      bVar6 = cmMakefile::IsOn(this->Makefile,&local_e8);
      if (bVar6) {
        std::operator+(&local_108,"CMAKE_",pbVar17);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_108);
        psVar16 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_128.field_2._M_allocated_capacity = *psVar16;
          local_128.field_2._8_8_ = plVar15[3];
          local_128._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar16;
          local_128._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_128._M_string_length = plVar15[1];
        *plVar15 = (long)psVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        pcVar9 = cmMakefile::GetDefinition(this->Makefile,&local_128);
        if (pcVar9 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar9,local_c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 !=
             (pLVar14->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,local_c0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath =
    outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if(use_install_rpath)
    {
    const char* install_rpath =
        this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
    }
  if(use_build_rpath || use_link_rpath)
    {
    std::string rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    const char *stagePath
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char *installPrefix
                  = this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for(std::vector<std::string>::const_iterator ri = rdirs.begin();
        ri != rdirs.end(); ++ri)
      {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if(use_build_rpath)
        {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0)
          {
          d = d.substr(rootPath.size());
          }
        else if (stagePath && *stagePath && d.find(stagePath) == 0)
          {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
          }
        if(emitted.insert(d).second)
          {
          runtimeDirs.push_back(d);
          }
        }
      else if(use_link_rpath)
        {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->CMakeInstance->GetHomeDirectory();
        const char* topBinaryDir =
            this->CMakeInstance->GetHomeOutputDirectory();
        if(!cmSystemTools::ComparePath(*ri, topSourceDir) &&
           !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topBinaryDir))
          {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0)
            {
            d = d.substr(rootPath.size());
            }
          else if (stagePath && *stagePath && d.find(stagePath) == 0)
            {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
            }
          if(emitted.insert(d).second)
            {
            runtimeDirs.push_back(d);
            }
          }
        }
      }
    }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for(std::vector<std::string>::const_iterator li = lc->Languages.begin();
      li != lc->Languages.end(); ++li)
    {
    std::string useVar = "CMAKE_" + *li +
      "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
    if(this->Makefile->IsOn(useVar))
      {
      std::string dirVar = "CMAKE_" + *li +
        "_IMPLICIT_LINK_DIRECTORIES";
      if(const char* dirs = this->Makefile->GetDefinition(dirVar))
        {
        cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}